

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O0

void __thiscall
btGeneric6DofConstraint::btGeneric6DofConstraint
          (btGeneric6DofConstraint *this,btRigidBody *rbB,btTransform *frameInB,
          bool useLinearReferenceFrameB)

{
  btTranslationalLimitMotor *pbVar1;
  btGeneric6DofConstraint *this_00;
  byte in_CL;
  btTranslationalLimitMotor *this_01;
  btRigidBody *in_RSI;
  undefined8 *in_RDI;
  btRigidBody *in_stack_ffffffffffffff18;
  btRigidBody *in_stack_ffffffffffffff20;
  undefined8 in_stack_ffffffffffffff28;
  btTypedConstraintType type;
  btTypedConstraint *in_stack_ffffffffffffff30;
  btVector3 *pbVar2;
  btVector3 *local_c8;
  btRotationalLimitMotor *local_b0;
  undefined8 *local_98;
  btTranslationalLimitMotor *local_80;
  
  type = (btTypedConstraintType)((ulong)in_stack_ffffffffffffff28 >> 0x20);
  btTypedConstraint::getFixedBody();
  btTypedConstraint::btTypedConstraint
            (in_stack_ffffffffffffff30,type,in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  *in_RDI = &PTR__btGeneric6DofConstraint_002e7098;
  btTransform::btTransform((btTransform *)in_stack_ffffffffffffff20);
  btTransform::btTransform
            ((btTransform *)in_stack_ffffffffffffff20,(btTransform *)in_stack_ffffffffffffff18);
  this_01 = (btTranslationalLimitMotor *)((long)in_RDI + 0x1c4);
  pbVar1 = (btTranslationalLimitMotor *)(in_RDI + 0x19);
  do {
    local_80 = pbVar1;
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_ffffffffffffff20);
    pbVar1 = (btTranslationalLimitMotor *)((local_80->m_stopERP).m_floats + 2);
  } while (pbVar1 != this_01);
  local_98 = (undefined8 *)((long)in_RDI + 0x1c4);
  do {
    btJacobianEntry::btJacobianEntry((btJacobianEntry *)in_stack_ffffffffffffff20);
    local_98 = (undefined8 *)((long)local_98 + 0x54);
  } while (local_98 != in_RDI + 0x58);
  btTranslationalLimitMotor::btTranslationalLimitMotor(local_80);
  local_b0 = (btRotationalLimitMotor *)((long)in_RDI + 0x37c);
  do {
    btRotationalLimitMotor::btRotationalLimitMotor(local_b0);
    local_b0 = local_b0 + 1;
  } while (local_b0 != (btRotationalLimitMotor *)((long)in_RDI + 0x43c));
  btTransform::btTransform((btTransform *)in_stack_ffffffffffffff20);
  btTransform::btTransform((btTransform *)in_stack_ffffffffffffff20);
  btVector3::btVector3((btVector3 *)(in_RDI + 0x98));
  local_c8 = (btVector3 *)(in_RDI + 0x9a);
  pbVar2 = (btVector3 *)(in_RDI + 0xa0);
  do {
    btVector3::btVector3(local_c8);
    local_c8 = local_c8 + 1;
  } while (local_c8 != pbVar2);
  btVector3::btVector3((btVector3 *)(in_RDI + 0xa0));
  btVector3::btVector3((btVector3 *)((long)in_RDI + 0x51c));
  *(byte *)((long)in_RDI + 0x52c) = in_CL & 1;
  *(undefined1 *)((long)in_RDI + 0x52d) = 1;
  *(undefined4 *)(in_RDI + 0xa6) = 0;
  *(undefined1 *)((long)in_RDI + 0x534) = 0;
  this_00 = (btGeneric6DofConstraint *)btRigidBody::getCenterOfMassTransform(in_RSI);
  btTransform::operator*((btTransform *)this_01,(btTransform *)local_80);
  btTransform::operator=((btTransform *)this_00,(btTransform *)in_stack_ffffffffffffff18);
  calculateTransforms(this_00);
  return;
}

Assistant:

btGeneric6DofConstraint::btGeneric6DofConstraint(btRigidBody& rbB, const btTransform& frameInB, bool useLinearReferenceFrameB)
        : btTypedConstraint(D6_CONSTRAINT_TYPE, getFixedBody(), rbB),
		m_frameInB(frameInB),
		m_useLinearReferenceFrameA(useLinearReferenceFrameB),
		m_useOffsetForConstraintFrame(D6_USE_FRAME_OFFSET),
		m_flags(0),
		m_useSolveConstraintObsolete(false)
{
	///not providing rigidbody A means implicitly using worldspace for body A
	m_frameInA = rbB.getCenterOfMassTransform() * m_frameInB;
	calculateTransforms();
}